

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

void telnet_negotiate(telnet_t *telnet,uchar cmd,int telopt)

{
  uchar telopt_00;
  byte bVar1;
  char local_23;
  uchar local_22;
  uchar local_21;
  telnet_rfc1143_t tStack_20;
  uchar bytes [3];
  telnet_rfc1143_t q;
  int telopt_local;
  uchar cmd_local;
  telnet_t *telnet_local;
  
  if (telopt < 0x200) {
    telopt_00 = (uchar)telopt;
    if ((telnet->flags & 1) == 0) {
      tStack_20 = _get_rfc1143(telnet,telopt);
      switch(cmd) {
      case 0xfb:
        if (((ulong)tStack_20 & 0xf00000000) == 0) {
          _set_rfc1143(telnet,telopt,'\x03',(char)((int)(tStack_20.state & 0xf0) >> 4));
          if (telopt < 0x100) {
            _send_negotiate(telnet,0xfb,telopt_00);
          }
          else {
            _exopl_send_negotiate(telnet,0xfb,telopt);
          }
        }
        else if ((tStack_20.state & 0xf) == 2) {
          _set_rfc1143(telnet,telopt,'\x04',(char)((int)(tStack_20.state & 0xf0) >> 4));
        }
        else if ((tStack_20.state & 0xf) == 5) {
          _set_rfc1143(telnet,telopt,'\x03',(char)((int)(tStack_20.state & 0xf0) >> 4));
        }
        break;
      case 0xfc:
        bVar1 = tStack_20.state & 0xf;
        if (bVar1 == 1) {
          _set_rfc1143(telnet,telopt,'\x02',(char)((int)(tStack_20.state & 0xf0) >> 4));
          if (telopt < 0x100) {
            _send_negotiate(telnet,0xfc,telopt_00);
          }
          else {
            _exopl_send_negotiate(telnet,0xfc,telopt);
          }
        }
        else if (bVar1 == 3) {
          _set_rfc1143(telnet,telopt,'\x05',(char)((int)(tStack_20.state & 0xf0) >> 4));
        }
        else if (bVar1 == 4) {
          _set_rfc1143(telnet,telopt,'\x02',(char)((int)(tStack_20.state & 0xf0) >> 4));
        }
        break;
      case 0xfd:
        bVar1 = tStack_20.state >> 4;
        if (bVar1 == 0) {
          _set_rfc1143(telnet,telopt,tStack_20.state & 0xf,'\x03');
          if (telopt < 0x100) {
            _send_negotiate(telnet,0xfd,telopt_00);
          }
          else {
            _exopl_send_negotiate(telnet,0xfd,telopt);
          }
        }
        else if (bVar1 == 2) {
          _set_rfc1143(telnet,telopt,tStack_20.state & 0xf,'\x04');
        }
        else if (bVar1 == 5) {
          _set_rfc1143(telnet,telopt,tStack_20.state & 0xf,'\x03');
        }
        break;
      case 0xfe:
        bVar1 = tStack_20.state >> 4;
        if (bVar1 == 1) {
          _set_rfc1143(telnet,telopt,tStack_20.state & 0xf,'\x02');
          if (telopt < 0x100) {
            _send_negotiate(telnet,0xfe,telopt_00);
          }
          else {
            _exopl_send_negotiate(telnet,0xfe,telopt);
          }
        }
        else if (bVar1 == 3) {
          _set_rfc1143(telnet,telopt,tStack_20.state & 0xf,'\x05');
        }
        else if (bVar1 == 4) {
          _set_rfc1143(telnet,telopt,tStack_20.state & 0xf,'\x02');
        }
      }
    }
    else {
      local_23 = -1;
      local_22 = cmd;
      local_21 = telopt_00;
      _send(telnet,&local_23,3);
    }
  }
  else {
    _error(telnet,0x546,"telnet_negotiate",TELNET_EBADVAL,0,
           "supplied telopt %d for negotiation is greater than 511",telopt);
  }
  return;
}

Assistant:

void telnet_negotiate(telnet_t *telnet, unsigned char cmd,
		int telopt) {
	telnet_rfc1143_t q;

	if (telopt > 511) {
		_error(telnet, __LINE__, __func__, TELNET_EBADVAL, 0,
				"supplied telopt %d for negotiation is greater than 511", telopt);
		return;
	}

	/* if we're in proxy mode, just send it now */
	if (telnet->flags & TELNET_FLAG_PROXY) {
		unsigned char bytes[3];
		bytes[0] = TELNET_IAC;
		bytes[1] = cmd;
		bytes[2] = (unsigned char)telopt;
		_sendu(telnet, bytes, 3);
		return;
	}

	/* get current option states */
	q = _get_rfc1143(telnet, telopt);

	switch (cmd) {
	/* advertise willingess to support an option */
	case TELNET_WILL:
		switch (Q_US(q)) {
		case Q_NO:
			_set_rfc1143(telnet, telopt, Q_WANTYES, Q_HIM(q));
			SEND_NEGOTIATION(telnet, TELNET_WILL, telopt);
			break;
		case Q_WANTNO:
			_set_rfc1143(telnet, telopt, Q_WANTNO_OP, Q_HIM(q));
			break;
		case Q_WANTYES_OP:
			_set_rfc1143(telnet, telopt, Q_WANTYES, Q_HIM(q));
			break;
		}
		break;

	/* force turn-off of locally enabled option */
	case TELNET_WONT:
		switch (Q_US(q)) {
		case Q_YES:
			_set_rfc1143(telnet, telopt, Q_WANTNO, Q_HIM(q));
			SEND_NEGOTIATION(telnet, TELNET_WONT, telopt);
			break;
		case Q_WANTYES:
			_set_rfc1143(telnet, telopt, Q_WANTYES_OP, Q_HIM(q));
			break;
		case Q_WANTNO_OP:
			_set_rfc1143(telnet, telopt, Q_WANTNO, Q_HIM(q));
			break;
		}
		break;

	/* ask remote end to enable an option */
	case TELNET_DO:
		switch (Q_HIM(q)) {
		case Q_NO:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES);
			SEND_NEGOTIATION(telnet, TELNET_DO, telopt);
			break;
		case Q_WANTNO:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO_OP);
			break;
		case Q_WANTYES_OP:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES);
			break;
		}
		break;

	/* demand remote end disable an option */
	case TELNET_DONT:
		switch (Q_HIM(q)) {
		case Q_YES:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO);
			SEND_NEGOTIATION(telnet, TELNET_DONT, telopt);
			break;
		case Q_WANTYES:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES_OP);
			break;
		case Q_WANTNO_OP:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO);
			break;
		}
		break;
	}
}